

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# second_order_all_pass_mel_cepstral_analysis.cc
# Opt level: O1

bool anon_unknown.dwarf_1501e::CoefficientsFrequencyTransform
               (vector<double,_std::allocator<double>_> *input,int input_length,int output_length,
               int fft_length,double alpha,double theta,
               vector<double,_std::allocator<double>_> *output,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *buffer)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  pointer pvVar4;
  bool bVar5;
  double *pdVar6;
  size_t __n;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  size_type __n_00;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  vector<double,_std::allocator<double>_> ww;
  InverseFastFourierTransform inverse_fourier_transform;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  real;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  imag;
  allocator_type local_e9;
  size_type local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  vector<double,_std::allocator<double>_> *local_c8;
  vector<double,_std::allocator<double>_> local_c0;
  InverseFastFourierTransform local_a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_70;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_e8 = (size_type)output_length;
  local_e0 = alpha;
  local_d8 = theta;
  if ((long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != local_e8) {
    std::vector<double,_std::allocator<double>_>::resize(output,local_e8);
  }
  if ((((local_e0 != 0.0) || (NAN(local_e0))) || (local_d8 != 0.0)) || (NAN(local_d8))) {
    if (((long)(buffer->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(buffer->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - local_e8 !=
        0) {
      __n_00 = (size_type)fft_length;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_a8,__n_00,
                 (allocator_type *)&local_48);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_70,local_e8,(value_type *)&local_a8,(allocator_type *)&local_c0);
      if (local_a8._vptr_InverseFastFourierTransform != (_func_int **)0x0) {
        operator_delete(local_a8._vptr_InverseFastFourierTransform);
      }
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_a8,__n_00,
                 (allocator_type *)&local_c0);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_48,local_e8,(value_type *)&local_a8,&local_e9);
      if (local_a8._vptr_InverseFastFourierTransform != (_func_int **)0x0) {
        operator_delete(local_a8._vptr_InverseFastFourierTransform);
      }
      local_50 = input;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_c0,__n_00,(allocator_type *)&local_a8);
      if (0 < fft_length) {
        local_d0 = 6.283185307179586 / (double)fft_length;
        uVar10 = 0;
        do {
          dVar12 = sptk::Warp((double)(int)uVar10 * local_d0,local_e0,local_d8);
          local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] = dVar12;
          uVar10 = uVar10 + 1;
        } while ((uint)fft_length != uVar10);
      }
      local_58 = buffer;
      sptk::InverseFastFourierTransform::InverseFastFourierTransform(&local_a8,fft_length);
      bVar11 = 0 < output_length;
      if (output_length < 1) {
        bVar5 = false;
      }
      else {
        local_d8 = (double)(ulong)(uint)output_length;
        local_d0 = (double)(__n_00 * 8 + -8);
        dVar12 = 0.0;
        local_c8 = output;
        do {
          if (0 < fft_length) {
            local_e0 = (double)SUB84(dVar12,0);
            uVar10 = 0;
            do {
              dVar13 = cos(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar10] * local_e0);
              local_70.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)dVar12].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar10] = dVar13;
              dVar13 = sin(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar10] * local_e0);
              local_48.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)dVar12].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar10] = -dVar13;
              uVar10 = uVar10 + 1;
            } while ((uint)fft_length != uVar10);
          }
          bVar5 = sptk::InverseFastFourierTransform::Run
                            (&local_a8,
                             local_70.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + (long)dVar12,
                             local_48.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + (long)dVar12);
          output = local_c8;
          if (!bVar5) {
            bVar5 = true;
            goto LAB_00108097;
          }
          if (1 < input_length) {
            pdVar1 = local_70.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)dVar12].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6 = (double *)((long)local_d0 + (long)pdVar1);
            uVar10 = 1;
            do {
              pdVar1[uVar10] = *pdVar6 + pdVar1[uVar10];
              uVar10 = uVar10 + 1;
              pdVar6 = pdVar6 + -1;
            } while ((uint)input_length != uVar10);
          }
          dVar12 = (double)((long)dVar12 + 1);
          bVar11 = (ulong)dVar12 < (ulong)local_d8;
        } while (dVar12 != local_d8);
        bVar5 = false;
      }
LAB_00108097:
      local_a8._vptr_InverseFastFourierTransform =
           (_func_int **)&PTR__InverseFastFourierTransform_0011a868;
      local_a8.fast_fourier_transform_._vptr_FastFourierTransform =
           (_func_int **)&PTR__FastFourierTransform_0011a7d8;
      if (local_a8.fast_fourier_transform_.sine_table_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_a8.fast_fourier_transform_.sine_table_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      buffer = local_58;
      if (!bVar11) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(local_58,local_e8);
        if (output_length < 1) {
          bVar5 = false;
        }
        else {
          uVar10 = 0;
          do {
            std::vector<double,_std::allocator<double>_>::resize
                      ((buffer->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar10,(long)input_length);
            if (0 < input_length) {
              pdVar1 = local_70.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar10].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar3 = *(long *)&(buffer->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar10].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data;
              uVar7 = 0;
              do {
                *(double *)(lVar3 + uVar7 * 8) = pdVar1[uVar7];
                uVar7 = uVar7 + 1;
              } while ((uint)input_length != uVar7);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != (uint)output_length);
          bVar5 = false;
        }
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_48);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_70);
      input = local_50;
      if (bVar5) {
        return false;
      }
    }
    if (0 < output_length) {
      pvVar4 = (buffer->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        dVar12 = 0.0;
        pdVar9 = pdVar6;
        for (pdVar8 = pvVar4[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar8 != *(pointer *)
                       ((long)&pvVar4[uVar10].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data + 8); pdVar8 = pdVar8 + 1) {
          dVar12 = dVar12 + *pdVar8 * *pdVar9;
          pdVar9 = pdVar9 + 1;
        }
        pdVar1[uVar10] = dVar12;
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uint)output_length);
    }
  }
  else if (input_length < output_length) {
    pdVar1 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __n = (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
    if (__n != 0) {
      memmove((output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start,pdVar1,__n);
    }
    pdVar2 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar1 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start + input_length;
    if (pdVar1 != pdVar2) {
      memset(pdVar1,0,((long)pdVar2 + (-8 - (long)pdVar1) & 0xfffffffffffffff8U) + 8);
    }
  }
  else if (output_length != 0) {
    memmove((output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start,
            (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start,local_e8 << 3);
  }
  return true;
}

Assistant:

bool CoefficientsFrequencyTransform(const std::vector<double>& input,
                                    int input_length, int output_length,
                                    int fft_length, double alpha, double theta,
                                    std::vector<double>* output,
                                    std::vector<std::vector<double> >* buffer) {
  if (output->size() != static_cast<std::size_t>(output_length)) {
    output->resize(output_length);
  }

  if (0.0 == alpha && 0.0 == theta) {
    if (input_length < output_length) {
      std::copy(input.begin(), input.end(), output->begin());
      std::fill(output->begin() + input_length, output->end(), 0.0);
    } else {
      std::copy(input.begin(), input.begin() + output_length, output->begin());
    }
    return true;
  }

  if (buffer->size() != static_cast<std::size_t>(output_length)) {
    std::vector<std::vector<double> > real(output_length,
                                           std::vector<double>(fft_length));
    std::vector<std::vector<double> > imag(output_length,
                                           std::vector<double>(fft_length));
    {
      std::vector<double> ww(fft_length);
      {
        const double delta(sptk::kTwoPi / fft_length);
        for (int j(0); j < fft_length; ++j) {
          ww[j] = sptk::Warp(delta * j, alpha, theta);
        }
      }

      sptk::InverseFastFourierTransform inverse_fourier_transform(fft_length);
      for (int m(0); m < output_length; ++m) {
        for (int j(0); j < fft_length; ++j) {
          real[m][j] = std::cos(ww[j] * m);
          imag[m][j] = -std::sin(ww[j] * m);
        }

        if (!inverse_fourier_transform.Run(&real[m], &imag[m])) {
          return false;
        }

        for (int j(1); j < input_length; ++j) {
          real[m][j] += real[m][fft_length - j];
        }
      }
    }

    buffer->resize(output_length);
    for (int m2(0); m2 < output_length; ++m2) {
      (*buffer)[m2].resize(input_length);
      for (int m1(0); m1 < input_length; ++m1) {
        (*buffer)[m2][m1] = real[m2][m1];
      }
    }
  }

  for (int m2(0); m2 < output_length; ++m2) {
    (*output)[m2] = std::inner_product((*buffer)[m2].begin(),
                                       (*buffer)[m2].end(), input.begin(), 0.0);
  }

  return true;
}